

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandMeshVertexBufferMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [32];
  ostringstream local_5b8 [8];
  ostringstream oss_vertices;
  string local_440 [8];
  string vertices_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  ostringstream local_400 [8];
  ostringstream oss_vertexCountOutput;
  string local_288 [8];
  string vertexcountoutput_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  ostringstream local_248 [8];
  ostringstream oss_vertexCapacityInput;
  string local_d0 [8];
  string vertexcapacityinput_prefix;
  __cxx11 local_b0 [32];
  string local_90 [8];
  string vertexupdatetime_prefix;
  XrHandMeshVertexBufferMSFT local_60;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrHandMeshVertexBufferMSFT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrHandMeshVertexBufferMSFT *)gen_dispatch_table;
  PointerToHexString<XrHandMeshVertexBufferMSFT>(&local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"vertexUpdateTime");
  pvVar1 = local_40;
  std::__cxx11::to_string(local_b0,*(long *)prefix_local);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [7])"XrTime",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::string(local_d0,(string *)prefix);
  std::__cxx11::string::operator+=(local_d0,"vertexCapacityInput");
  std::__cxx11::ostringstream::ostringstream(local_248);
  poVar2 = std::operator<<((ostream *)local_248,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::ostream::operator<<(poVar2,*(uint *)(prefix_local + 8));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])"uint32_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,local_268
            );
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::string(local_288,(string *)prefix);
  std::__cxx11::string::operator+=(local_288,"vertexCountOutput");
  std::__cxx11::ostringstream::ostringstream(local_400);
  poVar2 = std::operator<<((ostream *)local_400,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::ostream::operator<<(poVar2,*(uint *)(prefix_local + 0xc));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])"uint32_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
             local_420);
  std::__cxx11::string::~string((string *)local_420);
  std::__cxx11::string::string(local_440,(string *)prefix);
  std::__cxx11::string::operator+=(local_440,"vertices");
  std::__cxx11::ostringstream::ostringstream(local_5b8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,std::hex);
  std::ostream::operator<<(poVar2,*(void **)(prefix_local + 0x10));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[22],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [22])"XrHandMeshVertexMSFT*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
             local_5d8);
  std::__cxx11::string::~string((string *)local_5d8);
  gen_dispatch_table_local._7_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_5b8);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::ostringstream::~ostringstream(local_400);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::ostringstream::~ostringstream(local_248);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_90);
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandMeshVertexBufferMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string vertexupdatetime_prefix = prefix;
        vertexupdatetime_prefix += "vertexUpdateTime";
        contents.emplace_back("XrTime", vertexupdatetime_prefix, std::to_string(value->vertexUpdateTime));
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices;
        oss_vertices << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("XrHandMeshVertexMSFT*", vertices_prefix, oss_vertices.str());
        return true;
    } catch(...) {
    }
    return false;
}